

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagExpressionParser::acceptChar(TagExpressionParser *this,char c)

{
  char in_SIL;
  value_type *in_RDI;
  vector<Catch::TagSet,_std::allocator<Catch::TagSet>_> *unaff_retaddr;
  
  if (in_SIL == ',') {
    std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::push_back(unaff_retaddr,in_RDI);
  }
  else if (in_SIL == '~') {
    *(undefined1 *)&(in_RDI->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_black;
  }
  return;
}

Assistant:

virtual void acceptChar( char c ) {
            switch( c ) {
                case '~':
                    m_isNegated = true;
                    break;
                case ',':
                    m_exp.m_tagSets.push_back( m_currentTagSet );
                    break;
            }
        }